

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O0

uint64_t __thiscall GCSFilter::HashToRange(GCSFilter *this,Element *element)

{
  long lVar1;
  uint64_t uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  uint64_t hash;
  undefined1 *k1;
  CSipHasher *in_stack_ffffffffffffff98;
  CSipHasher *in_stack_ffffffffffffffb8;
  CSipHasher *in_stack_ffffffffffffffc8;
  Span<const_unsigned_char> in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  k1 = &stack0xffffffffffffffc8;
  CSipHasher::CSipHasher(in_stack_ffffffffffffff98,(uint64_t)in_RDI,(uint64_t)k1);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)in_stack_ffffffffffffff98,in_RDI,k1);
  CSipHasher::Write(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffe0);
  CSipHasher::Finalize(in_stack_ffffffffffffffb8);
  uVar2 = FastRange64((uint64_t)in_stack_ffffffffffffff98,(uint64_t)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t GCSFilter::HashToRange(const Element& element) const
{
    uint64_t hash = CSipHasher(m_params.m_siphash_k0, m_params.m_siphash_k1)
        .Write(element)
        .Finalize();
    return FastRange64(hash, m_F);
}